

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_refit.cpp
# Opt level: O1

void __thiscall
embree::avx::BVHNRefitT<8,_embree::UserGeometry,_embree::Object>::build
          (BVHNRefitT<8,_embree::UserGeometry,_embree::Object> *this)

{
  uint uVar1;
  
  uVar1 = (this->mesh->super_AccelSet).super_Geometry.numPrimitives;
  if (uVar1 == this->topologyVersion) {
    BVHNRefitter<8>::refit
              ((this->refitter)._M_t.
               super___uniq_ptr_impl<embree::avx::BVHNRefitter<8>,_std::default_delete<embree::avx::BVHNRefitter<8>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_embree::avx::BVHNRefitter<8>_*,_std::default_delete<embree::avx::BVHNRefitter<8>_>_>
               .super__Head_base<0UL,_embree::avx::BVHNRefitter<8>_*,_false>._M_head_impl);
    return;
  }
  this->topologyVersion = uVar1;
  (**(code **)((long)(((this->builder)._M_t.
                       super___uniq_ptr_impl<embree::Builder,_std::default_delete<embree::Builder>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_embree::Builder_*,_std::default_delete<embree::Builder>_>
                       .super__Head_base<0UL,_embree::Builder_*,_false>._M_head_impl)->
                     super_RefCount)._vptr_RefCount + 0x20))();
  return;
}

Assistant:

void BVHNRefitT<N,Mesh,Primitive>::build()
    {
      if (mesh->topologyChanged(topologyVersion)) {
        topologyVersion = mesh->getTopologyVersion();
        builder->build();
      }
      else
        refitter->refit();
    }